

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O3

const_iterator __thiscall
FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::find(FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  int iVar1;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>
  _Var2;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>
  _Var3;
  
  _Var2 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,float>const*,std::vector<std::pair<std::__cxx11::string,float>,std::allocator<std::pair<std::__cxx11::string,float>>>>,std::__cxx11::string,__gnu_cxx::__ops::_Iter_comp_val<FlatMap<std::__cxx11::string,float,std::less<std::__cxx11::string>>::ValueToKeyComparator>>
                    ((this->vec_).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->vec_).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,key);
  _Var3._M_current =
       (this->vec_).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Var2._M_current != _Var3._M_current) &&
     (iVar1 = std::__cxx11::string::compare((string *)key), _Var3 = _Var2, iVar1 < 0)) {
    _Var3._M_current =
         (this->vec_).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  return (const_iterator)_Var3._M_current;
}

Assistant:

const_iterator find(const Key& key) const {
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), key, valueToKeyComp_);
        if (pos == vec_.end() || comp_(key, pos->first)) {
            return vec_.end();
        } else {
            return pos;
        }
    }